

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O0

UBool __thiscall icu_63::SimpleTimeZone::hasSameRules(SimpleTimeZone *this,TimeZone *other)

{
  bool bVar1;
  bool local_33;
  bool local_32;
  bool local_31;
  SimpleTimeZone *that;
  TimeZone *other_local;
  SimpleTimeZone *this_local;
  
  if (this == (SimpleTimeZone *)other) {
    this_local._7_1_ = true;
  }
  else {
    if (this == (SimpleTimeZone *)0x0) {
      __cxa_bad_typeid();
    }
    bVar1 = std::type_info::operator!=
                      ((type_info *)
                       (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[-1],
                       (type_info *)(other->super_UObject)._vptr_UObject[-1]);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      local_31 = false;
      if ((this->rawOffset == *(int *)((long)&other[1].fID.fUnion + 0xc)) &&
         (local_31 = false, this->useDaylight == *(char *)((long)&other[1].fID.fUnion + 0x10))) {
        local_32 = true;
        if (this->useDaylight != '\0') {
          local_33 = false;
          if (((((this->dstSavings == *(int *)((long)&other[1].fID.fUnion + 0x1c)) &&
                (local_33 = false, this->startMode == *(EMode *)((long)&other[1].fID.fUnion + 0x14))
                ) && (local_33 = false,
                     this->startMonth == *(char *)&other[1].super_UObject._vptr_UObject)) &&
              (((local_33 = false,
                this->startDay == *(char *)((long)&other[1].super_UObject._vptr_UObject + 1) &&
                (local_33 = false,
                this->startDayOfWeek == *(char *)((long)&other[1].super_UObject._vptr_UObject + 2)))
               && ((local_33 = false,
                   this->startTime == *(int *)((long)&other[1].super_UObject._vptr_UObject + 4) &&
                   ((local_33 = false,
                    this->startTimeMode ==
                    *(TimeMode *)&other[1].fID.super_Replaceable.super_UObject._vptr_UObject &&
                    (local_33 = false,
                    this->endMode == *(EMode *)((long)&other[1].fID.fUnion + 0x18))))))))) &&
             ((local_33 = false, this->endMonth == *(char *)&other[1].fID.fUnion &&
              ((((local_33 = false, this->endDay == *(char *)((long)&other[1].fID.fUnion + 1) &&
                 (local_33 = false, this->endDayOfWeek == *(char *)((long)&other[1].fID.fUnion + 2))
                 ) && (local_33 = false, this->endTime == other[1].fID.fUnion.fFields.fLength)) &&
               (local_33 = false,
               this->endTimeMode ==
               *(TimeMode *)((long)&other[1].fID.super_Replaceable.super_UObject._vptr_UObject + 4))
               ))))) {
            local_33 = this->startYear == other[1].fID.fUnion.fFields.fCapacity;
          }
          local_32 = local_33;
        }
        local_31 = local_32;
      }
      this_local._7_1_ = local_31;
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool 
SimpleTimeZone::hasSameRules(const TimeZone& other) const
{
    if (this == &other) return TRUE;
    if (typeid(*this) != typeid(other)) return FALSE;
    SimpleTimeZone *that = (SimpleTimeZone*)&other;
    return rawOffset     == that->rawOffset &&
        useDaylight     == that->useDaylight &&
        (!useDaylight
         // Only check rules if using DST
         || (dstSavings     == that->dstSavings &&
             startMode      == that->startMode &&
             startMonth     == that->startMonth &&
             startDay       == that->startDay &&
             startDayOfWeek == that->startDayOfWeek &&
             startTime      == that->startTime &&
             startTimeMode  == that->startTimeMode &&
             endMode        == that->endMode &&
             endMonth       == that->endMonth &&
             endDay         == that->endDay &&
             endDayOfWeek   == that->endDayOfWeek &&
             endTime        == that->endTime &&
             endTimeMode    == that->endTimeMode &&
             startYear      == that->startYear));
}